

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

CURLcode file_connect(connectdata *conn,_Bool *done)

{
  SessionHandle *data_00;
  undefined8 *puVar1;
  int iVar2;
  char *__file;
  int fd;
  FILEPROTO *file;
  char *real_path;
  SessionHandle *data;
  _Bool *done_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  puVar1 = (undefined8 *)(data_00->req).protop;
  __file = curl_easy_unescape(data_00,(data_00->state).path,0,(int *)0x0);
  if (__file == (char *)0x0) {
    conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    iVar2 = open64(__file,0);
    *puVar1 = __file;
    puVar1[1] = __file;
    *(int *)(puVar1 + 2) = iVar2;
    if ((((data_00->set).upload & 1U) == 0) && (iVar2 == -1)) {
      Curl_failf(data_00,"Couldn\'t open file %s",(data_00->state).path);
      file_done(conn,CURLE_FILE_COULDNT_READ_FILE,false);
      conn_local._4_4_ = CURLE_FILE_COULDNT_READ_FILE;
    }
    else {
      *done = true;
      conn_local._4_4_ = CURLE_OK;
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode file_connect(struct connectdata *conn, bool *done)
{
  struct SessionHandle *data = conn->data;
  char *real_path;
  struct FILEPROTO *file = data->req.protop;
  int fd;
#ifdef DOS_FILESYSTEM
  int i;
  char *actual_path;
#endif

  real_path = curl_easy_unescape(data, data->state.path, 0, NULL);
  if(!real_path)
    return CURLE_OUT_OF_MEMORY;

#ifdef DOS_FILESYSTEM
  /* If the first character is a slash, and there's
     something that looks like a drive at the beginning of
     the path, skip the slash.  If we remove the initial
     slash in all cases, paths without drive letters end up
     relative to the current directory which isn't how
     browsers work.

     Some browsers accept | instead of : as the drive letter
     separator, so we do too.

     On other platforms, we need the slash to indicate an
     absolute pathname.  On Windows, absolute paths start
     with a drive letter.
  */
  actual_path = real_path;
  if((actual_path[0] == '/') &&
      actual_path[1] &&
     (actual_path[2] == ':' || actual_path[2] == '|')) {
    actual_path[2] = ':';
    actual_path++;
  }

  /* change path separators from '/' to '\\' for DOS, Windows and OS/2 */
  for(i=0; actual_path[i] != '\0'; ++i)
    if(actual_path[i] == '/')
      actual_path[i] = '\\';

  fd = open_readonly(actual_path, O_RDONLY|O_BINARY);
  file->path = actual_path;
#else
  fd = open_readonly(real_path, O_RDONLY);
  file->path = real_path;
#endif
  file->freepath = real_path; /* free this when done */

  file->fd = fd;
  if(!data->set.upload && (fd == -1)) {
    failf(data, "Couldn't open file %s", data->state.path);
    file_done(conn, CURLE_FILE_COULDNT_READ_FILE, FALSE);
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  *done = TRUE;

  return CURLE_OK;
}